

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_GetSetVelocity_Test<pica::Particle<(pica::Dimension)3>_>::TestBody
          (ParticleTest_GetSetVelocity_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  double *pdVar1;
  bool bVar2;
  AssertHelper *this_00;
  Particle<(pica::Dimension)3> *in_RDI;
  double dVar3;
  FP FVar4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  MomentumType v;
  MomentumType newVelocity;
  ParticleType particle;
  AssertHelper *in_stack_fffffffffffffed0;
  FP3 *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  Particle<(pica::Dimension)3> *in_stack_fffffffffffffef0;
  Type in_stack_fffffffffffffefc;
  AssertHelper *in_stack_ffffffffffffff00;
  AssertionResult local_e8;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  AssertHelper *in_stack_ffffffffffffff30;
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *in_stack_ffffffffffffff50;
  double *in_stack_ffffffffffffff60;
  double *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff78;
  Vector3<double> local_68 [4];
  
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
            (in_stack_ffffffffffffff50);
  pica::Vector3<double>::Vector3(local_68,5243.1654,-5623000.0,-0.0065237);
  pica::Particle<(pica::Dimension)3>::setVelocity
            (in_stack_fffffffffffffef0,
             (MomentumType *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  (in_RDI->p).x = 1e-12;
  pica::Particle<(pica::Dimension)3>::getVelocity(in_RDI);
  dVar3 = pica::Vector3<double>::norm((Vector3<double> *)0x2025f7);
  pdVar1 = &(in_RDI->position).z;
  if (dVar3 < *pdVar1 || dVar3 == *pdVar1) {
    pica::Particle<(pica::Dimension)3>::getVelocity(in_RDI);
    pica::dist(&in_RDI->position,in_stack_fffffffffffffed8);
    testing::internal::CmpHelperLE<double,double>
              ((char *)in_stack_ffffffffffffff78.ptr_,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff00);
      testing::AssertionResult::failure_message((AssertionResult *)0x202815);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                 (char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,(char *)in_RDI);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff30,
                 (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffed0);
      testing::Message::~Message((Message *)0x202861);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2028c1);
  }
  else {
    pica::Particle<(pica::Dimension)3>::getVelocity(in_RDI);
    FVar4 = pica::dist(&in_RDI->position,in_stack_fffffffffffffed8);
    dVar3 = pica::Vector3<double>::norm((Vector3<double> *)0x202644);
    testing::internal::CmpHelperLE<double,double>
              ((char *)in_stack_ffffffffffffff78.ptr_,in_stack_ffffffffffffff70,
               (double *)(FVar4 / dVar3),in_stack_ffffffffffffff60);
    bVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff70);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff00);
      this_00 = (AssertHelper *)
                testing::AssertionResult::failure_message((AssertionResult *)0x2026ba);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                 (char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,(char *)in_RDI);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff30,
                 (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0x20270e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x202774);
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetVelocity)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;

    ParticleType particle = this->randomParticle();
    MomentumType newVelocity(5243.1654, -56.23e5, -65.237e-4);
    particle.setVelocity(newVelocity);
    this->maxRelativeError = 1e-12;
    MomentumType v = particle.getVelocity();
    ASSERT_NEAR_VECTOR(newVelocity, particle.getVelocity());
}